

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<TCBPoint>::reserve(QList<TCBPoint> *this,qsizetype asize)

{
  bool bVar1;
  QArrayDataPointer<TCBPoint> *this_00;
  qsizetype qVar2;
  TCBPoint *e;
  TCBPoint *b;
  Data *pDVar3;
  long in_RSI;
  QArrayDataPointer<TCBPoint> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<TCBPoint> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<TCBPoint> *in_stack_ffffffffffffff80;
  QArrayDataPointer<TCBPoint> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QPodArrayOps<TCBPoint> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<TCBPoint> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QArrayDataPointer<TCBPoint> *)capacity((QList<TCBPoint> *)0x71b1af);
  qVar2 = QArrayDataPointer<TCBPoint>::freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)this_00 - qVar2) {
    QArrayDataPointer<TCBPoint>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<TCBPoint>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) goto LAB_0071b353;
    QArrayDataPointer<TCBPoint>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<TCBPoint>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<TCBPoint>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<TCBPoint>::setFlag
                ((QArrayDataPointer<TCBPoint> *)0x71b257,(ArrayOptions)f.i);
      goto LAB_0071b353;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (TCBPoint *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<TCBPoint> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<TCBPoint>::QArrayDataPointer
            (this_00,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  e = (TCBPoint *)QArrayDataPointer<TCBPoint>::operator->(&local_38);
  QArrayDataPointer<TCBPoint>::operator->(in_RDI);
  b = QArrayDataPointer<TCBPoint>::begin((QArrayDataPointer<TCBPoint> *)0x71b2d7);
  QArrayDataPointer<TCBPoint>::operator->(in_RDI);
  QArrayDataPointer<TCBPoint>::end((QArrayDataPointer<TCBPoint> *)e);
  QtPrivate::QPodArrayOps<TCBPoint>::copyAppend(in_stack_ffffffffffffff90,b,e);
  pDVar3 = QArrayDataPointer<TCBPoint>::d_ptr(&local_38);
  if (pDVar3 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<TCBPoint> *)QArrayDataPointer<TCBPoint>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)e,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<TCBPoint>::setFlag
              ((QArrayDataPointer<TCBPoint> *)0x71b33a,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<TCBPoint>::swap((QArrayDataPointer<TCBPoint> *)e,in_stack_ffffffffffffff78);
  QArrayDataPointer<TCBPoint>::~QArrayDataPointer((QArrayDataPointer<TCBPoint> *)e);
LAB_0071b353:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}